

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface.cpp
# Opt level: O0

double __thiscall Interface::log(Interface *this,double __x)

{
  ostream *poVar1;
  string *in_RSI;
  double dVar2;
  string *s_local;
  Interface *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->logout,in_RSI);
  dVar2 = (double)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if ((this->if_file & 1U) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,in_RSI);
    dVar2 = (double)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return dVar2;
}

Assistant:

void Interface::log(string s) {
    logout << s << endl;
    if (!if_file)
        cout << s << endl;
}